

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

bool __thiscall
diligent_spirv_cross::Compiler::block_is_loop_candidate
          (Compiler *this,SPIRBlock *block,Method method)

{
  BlockID *pBVar1;
  bool bVar2;
  bool bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  SPIRBlock *pSVar6;
  SPIRBlock *pSVar7;
  SPIRBlock *pSVar8;
  SPIRBlock *to;
  long lVar9;
  Phi *pPVar10;
  byte bVar11;
  uint32_t uVar12;
  byte bVar13;
  byte bVar14;
  
  if (block->disable_block_optimization != false) {
    return false;
  }
  if (block->complex_continue != false) {
    return false;
  }
  if (method == MergeToSelectContinueForLoop) {
LAB_0068c9dd:
    pSVar6 = maybe_get<diligent_spirv_cross::SPIRBlock>(this,(block->false_block).id);
    pSVar7 = maybe_get<diligent_spirv_cross::SPIRBlock>(this,(block->true_block).id);
    pSVar8 = maybe_get<diligent_spirv_cross::SPIRBlock>(this,(block->merge_block).id);
    uVar5 = (block->merge_block).id;
    uVar4 = (block->false_block).id;
    bVar2 = true;
    if (uVar4 != uVar5) {
      if (pSVar8 == (SPIRBlock *)0x0 || pSVar6 == (SPIRBlock *)0x0) {
        bVar2 = false;
        uVar4 = uVar5;
      }
      else {
        bVar2 = execution_is_noop(this,pSVar6,pSVar8);
        uVar4 = (block->merge_block).id;
      }
    }
    bVar3 = true;
    uVar5 = (block->true_block).id;
    uVar12 = uVar4;
    if (uVar5 == uVar4) {
      bVar14 = 0;
    }
    else {
      if (pSVar8 == (SPIRBlock *)0x0 || pSVar7 == (SPIRBlock *)0x0) {
        bVar3 = false;
      }
      else {
        bVar3 = execution_is_noop(this,pSVar7,pSVar8);
        uVar5 = (block->true_block).id;
        uVar12 = (block->merge_block).id;
      }
      uVar4 = uVar5;
      if (uVar4 == uVar12) {
        bVar14 = 0;
      }
      else {
        bVar14 = bVar2 & uVar4 != (block->super_IVariant).self.id;
      }
    }
    uVar5 = (block->false_block).id;
    if (uVar5 == uVar12) {
      bVar13 = 0;
    }
    else {
      bVar13 = bVar3 & uVar5 != (block->super_IVariant).self.id;
    }
    bVar11 = (bVar14 | bVar13) &
             (block->merge == MergeLoop && *(int *)&(block->super_IVariant).field_0xc == 2);
    if ((bVar14 == 1 && method == MergeToSelectContinueForLoop) && (bVar11 != 0)) {
      if (uVar4 != (block->continue_block).id) {
        return false;
      }
    }
    else if ((method == MergeToSelectContinueForLoop & bVar13 & bVar11) == 1) {
      if (uVar5 != (block->continue_block).id) {
        return false;
      }
    }
    else if (bVar11 == 0) {
      return false;
    }
    lVar9 = (block->phi_variables).super_VectorView<diligent_spirv_cross::SPIRBlock::Phi>.
            buffer_size * 0xc;
    pPVar10 = (block->phi_variables).super_VectorView<diligent_spirv_cross::SPIRBlock::Phi>.ptr;
    do {
      if (lVar9 == 0) {
        pSVar6 = maybe_get<diligent_spirv_cross::SPIRBlock>(this,uVar12);
        if (pSVar6 == (SPIRBlock *)0x0) {
          return true;
        }
        lVar9 = (pSVar6->phi_variables).super_VectorView<diligent_spirv_cross::SPIRBlock::Phi>.
                buffer_size * 0xc;
        pPVar10 = (pSVar6->phi_variables).super_VectorView<diligent_spirv_cross::SPIRBlock::Phi>.ptr
        ;
        do {
          bVar2 = lVar9 == 0;
          if (bVar2) {
            return bVar2;
          }
          lVar9 = lVar9 + -0xc;
          pBVar1 = &pPVar10->parent;
          pPVar10 = pPVar10 + 1;
        } while (pBVar1->id != (block->super_IVariant).self.id);
        return bVar2;
      }
      lVar9 = lVar9 + -0xc;
      pBVar1 = &pPVar10->parent;
      pPVar10 = pPVar10 + 1;
    } while (pBVar1->id != (block->super_IVariant).self.id);
    return false;
  }
  if (method != MergeToDirectForLoop) {
    if (method != MergeToSelectForLoop) {
      return false;
    }
    goto LAB_0068c9dd;
  }
  if (*(int *)&(block->super_IVariant).field_0xc != 1) {
    return false;
  }
  if (block->merge != MergeLoop) {
    return false;
  }
  bVar2 = block_is_noop(this,block);
  if (!bVar2) {
    return false;
  }
  pSVar6 = get<diligent_spirv_cross::SPIRBlock>(this,(block->next_block).id);
  pSVar7 = maybe_get<diligent_spirv_cross::SPIRBlock>(this,(pSVar6->false_block).id);
  pSVar8 = maybe_get<diligent_spirv_cross::SPIRBlock>(this,(pSVar6->true_block).id);
  to = maybe_get<diligent_spirv_cross::SPIRBlock>(this,(block->merge_block).id);
  uVar4 = (pSVar6->false_block).id;
  uVar5 = (block->merge_block).id;
  bVar2 = true;
  if (uVar4 != uVar5) {
    if (to == (SPIRBlock *)0x0 || pSVar7 == (SPIRBlock *)0x0) {
      bVar2 = false;
      uVar4 = uVar5;
    }
    else {
      bVar2 = execution_is_noop(this,pSVar7,to);
      uVar4 = (block->merge_block).id;
    }
  }
  bVar3 = true;
  uVar5 = (pSVar6->true_block).id;
  if (uVar5 != uVar4) {
    if (to == (SPIRBlock *)0x0 || pSVar8 == (SPIRBlock *)0x0) {
      bVar3 = false;
    }
    else {
      bVar3 = execution_is_noop(this,pSVar8,to);
      uVar5 = (pSVar6->true_block).id;
      uVar4 = (block->merge_block).id;
    }
    if (uVar5 != uVar4) {
      bVar14 = bVar2 & uVar5 != (block->super_IVariant).self.id;
      goto LAB_0068cc7e;
    }
  }
  bVar14 = 0;
LAB_0068cc7e:
  uVar5 = (pSVar6->false_block).id;
  if (uVar5 == uVar4) {
    bVar13 = 0;
  }
  else {
    bVar13 = bVar3 & uVar5 != (block->super_IVariant).self.id;
  }
  if (*(int *)&(pSVar6->super_IVariant).field_0xc != 2) {
    return false;
  }
  if (pSVar6->merge != MergeNone) {
    return false;
  }
  if (bVar14 != 0 || bVar13 != 0) {
    pSVar7 = maybe_get<diligent_spirv_cross::SPIRBlock>(this,uVar4);
    if (pSVar7 == (SPIRBlock *)0x0) {
      return true;
    }
    pPVar10 = (pSVar7->phi_variables).super_VectorView<diligent_spirv_cross::SPIRBlock::Phi>.ptr;
    lVar9 = (pSVar7->phi_variables).super_VectorView<diligent_spirv_cross::SPIRBlock::Phi>.
            buffer_size * 0xc;
    while( true ) {
      bVar2 = lVar9 == 0;
      if (bVar2) {
        return bVar2;
      }
      uVar5 = (pPVar10->parent).id;
      if (uVar5 == (block->super_IVariant).self.id) break;
      pPVar10 = pPVar10 + 1;
      lVar9 = lVar9 + -0xc;
      if (uVar5 == (pSVar6->false_block).id) {
        return bVar2;
      }
    }
    return bVar2;
  }
  return false;
}

Assistant:

bool Compiler::block_is_loop_candidate(const SPIRBlock &block, SPIRBlock::Method method) const
{
	// Tried and failed.
	if (block.disable_block_optimization || block.complex_continue)
		return false;

	if (method == SPIRBlock::MergeToSelectForLoop || method == SPIRBlock::MergeToSelectContinueForLoop)
	{
		// Try to detect common for loop pattern
		// which the code backend can use to create cleaner code.
		// for(;;) { if (cond) { some_body; } else { break; } }
		// is the pattern we're looking for.
		const auto *false_block = maybe_get<SPIRBlock>(block.false_block);
		const auto *true_block = maybe_get<SPIRBlock>(block.true_block);
		const auto *merge_block = maybe_get<SPIRBlock>(block.merge_block);

		bool false_block_is_merge = block.false_block == block.merge_block ||
		                            (false_block && merge_block && execution_is_noop(*false_block, *merge_block));

		bool true_block_is_merge = block.true_block == block.merge_block ||
		                           (true_block && merge_block && execution_is_noop(*true_block, *merge_block));

		bool positive_candidate =
		    block.true_block != block.merge_block && block.true_block != block.self && false_block_is_merge;

		bool negative_candidate =
		    block.false_block != block.merge_block && block.false_block != block.self && true_block_is_merge;

		bool ret = block.terminator == SPIRBlock::Select && block.merge == SPIRBlock::MergeLoop &&
		           (positive_candidate || negative_candidate);

		if (ret && positive_candidate && method == SPIRBlock::MergeToSelectContinueForLoop)
			ret = block.true_block == block.continue_block;
		else if (ret && negative_candidate && method == SPIRBlock::MergeToSelectContinueForLoop)
			ret = block.false_block == block.continue_block;

		// If we have OpPhi which depends on branches which came from our own block,
		// we need to flush phi variables in else block instead of a trivial break,
		// so we cannot assume this is a for loop candidate.
		if (ret)
		{
			for (auto &phi : block.phi_variables)
				if (phi.parent == block.self)
					return false;

			auto *merge = maybe_get<SPIRBlock>(block.merge_block);
			if (merge)
				for (auto &phi : merge->phi_variables)
					if (phi.parent == block.self)
						return false;
		}
		return ret;
	}
	else if (method == SPIRBlock::MergeToDirectForLoop)
	{
		// Empty loop header that just sets up merge target
		// and branches to loop body.
		bool ret = block.terminator == SPIRBlock::Direct && block.merge == SPIRBlock::MergeLoop && block_is_noop(block);

		if (!ret)
			return false;

		auto &child = get<SPIRBlock>(block.next_block);

		const auto *false_block = maybe_get<SPIRBlock>(child.false_block);
		const auto *true_block = maybe_get<SPIRBlock>(child.true_block);
		const auto *merge_block = maybe_get<SPIRBlock>(block.merge_block);

		bool false_block_is_merge = child.false_block == block.merge_block ||
		                            (false_block && merge_block && execution_is_noop(*false_block, *merge_block));

		bool true_block_is_merge = child.true_block == block.merge_block ||
		                           (true_block && merge_block && execution_is_noop(*true_block, *merge_block));

		bool positive_candidate =
		    child.true_block != block.merge_block && child.true_block != block.self && false_block_is_merge;

		bool negative_candidate =
		    child.false_block != block.merge_block && child.false_block != block.self && true_block_is_merge;

		ret = child.terminator == SPIRBlock::Select && child.merge == SPIRBlock::MergeNone &&
		      (positive_candidate || negative_candidate);

		if (ret)
		{
			auto *merge = maybe_get<SPIRBlock>(block.merge_block);
			if (merge)
				for (auto &phi : merge->phi_variables)
					if (phi.parent == block.self || phi.parent == child.false_block)
						return false;
		}

		return ret;
	}
	else
		return false;
}